

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O2

OptimizerResult
TasGrid::Optimizer::computeLocalMaximum<(TasGrid::TypeOneDRule)20>
          (CurrentNodes<(TasGrid::TypeOneDRule)20> *current,double left_node,double right_node)

{
  double dVar1;
  double dVar2;
  double right;
  double dVar3;
  double dVar4;
  OptimizerResult OVar5;
  OptimizerResult OVar6;
  OptimizerResult OVar7;
  OptimizerResult OVar8;
  anon_class_8_1_c685f059 func;
  double local_60;
  double local_58;
  double local_50;
  double local_40;
  anon_class_8_1_c685f059 local_18;
  
  local_60 = (right_node - left_node) * 0.5;
  local_18.current = current;
  OVar5 = computeLocalMaximum<(TasGrid::TypeOneDRule)20>::anon_class_8_1_c685f059::operator()
                    (&local_18,left_node);
  OVar6 = computeLocalMaximum<(TasGrid::TypeOneDRule)20>::anon_class_8_1_c685f059::operator()
                    (&local_18,local_60 + left_node);
  OVar7 = computeLocalMaximum<(TasGrid::TypeOneDRule)20>::anon_class_8_1_c685f059::operator()
                    (&local_18,right_node);
  do {
    OVar8 = OVar7;
    dVar3 = OVar6.value;
    while( true ) {
      local_40 = OVar5.value;
      local_50 = OVar5.node;
      dVar4 = OVar6.value;
      local_58 = OVar6.node;
      OVar6.value = dVar3;
      OVar6.node = local_58;
      dVar2 = OVar8.value;
      right = OVar8.node;
      if (local_60 <= 1e-15) {
        OVar7 = performSecantSearch<(TasGrid::TypeOneDRule)20>(current,local_50,right);
        OVar7 = computeLocalMaximum<(TasGrid::TypeOneDRule)20>::anon_class_8_1_c685f059::operator()
                          (&local_18,OVar7.node);
        return OVar7;
      }
      dVar1 = dVar2;
      if (dVar2 <= local_40) {
        dVar1 = local_40;
      }
      if (dVar4 < dVar1) break;
      local_60 = local_60 * 0.5;
      OVar5 = computeLocalMaximum<(TasGrid::TypeOneDRule)20>::anon_class_8_1_c685f059::operator()
                        (&local_18,local_58 - local_60);
      OVar8 = computeLocalMaximum<(TasGrid::TypeOneDRule)20>::anon_class_8_1_c685f059::operator()
                        (&local_18,local_58 + local_60);
    }
    if (dVar2 <= dVar4) {
      dVar2 = dVar4;
    }
    if (dVar2 <= local_40) {
      if (left_node <= local_50 - local_60) {
        OVar7 = computeLocalMaximum<(TasGrid::TypeOneDRule)20>::anon_class_8_1_c685f059::operator()
                          (&local_18,local_50 - local_60);
        OVar6 = OVar5;
        OVar5 = OVar7;
      }
      else {
        local_60 = local_60 * 0.5;
        OVar6 = computeLocalMaximum<(TasGrid::TypeOneDRule)20>::anon_class_8_1_c685f059::operator()
                          (&local_18,local_50 + local_60);
      }
      OVar7.value = dVar3;
      OVar7.node = local_58;
    }
    else if (right + local_60 <= right_node) {
      OVar7 = computeLocalMaximum<(TasGrid::TypeOneDRule)20>::anon_class_8_1_c685f059::operator()
                        (&local_18,right + local_60);
      OVar5.value = dVar3;
      OVar5.node = local_58;
      OVar6 = OVar8;
    }
    else {
      local_60 = local_60 * 0.5;
      OVar6 = computeLocalMaximum<(TasGrid::TypeOneDRule)20>::anon_class_8_1_c685f059::operator()
                        (&local_18,right - local_60);
      OVar5.value = dVar3;
      OVar5.node = local_58;
      OVar7 = OVar8;
    }
  } while( true );
}

Assistant:

OptimizerResult computeLocalMaximum(CurrentNodes<rule> const& current, double left_node, double right_node){
    auto func = [&](double x)->OptimizerResult{ return {x, getValue<rule>(current, x)}; };

    double pattern = 0.5 * (right_node - left_node); // pattern width
    OptimizerResult left   = func(left_node);
    OptimizerResult middle = func(left_node + pattern);
    OptimizerResult right  = func(right_node);

    // if differentiable, use coarse tolerance since we will post-process.
    double tolerance = (HasDerivative<rule>::value) ? Maths::num_tol * 1.E-3 : Maths::num_tol;

    while(pattern > tolerance){
        if (middle.value >= std::max(left.value, right.value)){ // middle is largest, shrink
            pattern /= 2.0;
            left  = func(middle.node - pattern);
            right = func(middle.node + pattern);
        }else if (left.value >= std::max(middle.value, right.value)){ // left is the largest
            if (left.node - pattern < left_node){ // if going out of bounds
                pattern /= 2.0;
                right  = middle;
                middle = func(left.node + pattern);
            }else{ // shift left
                right  = middle;
                middle = left;
                left  = func(middle.node - pattern);
            }
        }else{ // right must be the largest
            if (right.node + pattern > right_node){ // if going out of bounds
                pattern /= 2.0;
                left   = middle;
                middle = func(right.node - pattern);
            }else{ // shift right
                left   = middle;
                middle = right;
                right  = func(middle.node + pattern);
            }
        }
    }

    if (HasDerivative<rule>::value){
        middle = performSecantSearch(current, left.node, right.node); // this returns the derivative
        middle = func(middle.node);
    }

    return middle;
}